

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  EnumDescriptor *this_00;
  size_t __n;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LogMessage *other;
  EnumValueDescriptor *pEVar5;
  long *plVar6;
  _func_int **pp_Var7;
  byte bVar8;
  size_type *psVar9;
  long i;
  int64 value;
  int64 int_value;
  string local_f0;
  undefined1 local_d0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  EnumDescriptor *local_38;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4)) {
  case 1:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_d0,0x7fffffff);
    if (!bVar3) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x18])
              (reflection,message,field,local_d0._0_8_ & 0xffffffff);
    return true;
  case 2:
    bVar3 = ConsumeSignedInteger(this,(int64 *)local_d0,0x7fffffffffffffff);
    if (!bVar3) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x19])
              (reflection,message,field,local_d0._0_8_);
    break;
  case 3:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,0xffffffff);
    if (!bVar3) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1a])
              (reflection,message,field,local_d0._0_8_ & 0xffffffff);
    break;
  case 4:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,0xffffffffffffffff);
    if (!bVar3) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1b])
              (reflection,message,field,local_d0._0_8_);
    break;
  case 5:
    bVar3 = ConsumeDouble(this,(double *)local_d0);
    if (!bVar3) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1d])
              ((int)local_d0._0_8_,reflection,message,field);
    break;
  case 6:
    bVar3 = ConsumeDouble(this,(double *)local_d0);
    if (!bVar3) {
      return false;
    }
    (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1c])
              ((float)(double)local_d0._0_8_,reflection,message,field);
    break;
  case 7:
    if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
      bVar3 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,1);
      if (bVar3) {
        (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1e])
                  (reflection,message,field,(ulong)((pointer)local_d0._0_8_ != (pointer)0x0));
        return true;
      }
      return false;
    }
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    local_d0._0_8_ = local_d0 + 0x10;
    bVar3 = ConsumeIdentifier(this,(string *)local_d0);
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare(local_d0);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_d0), iVar4 == 0)) {
        if (*(int *)(field + 0x30) == 3) {
          pp_Var7 = reflection->_vptr_Reflection + 0x3e;
        }
        else {
          pp_Var7 = reflection->_vptr_Reflection + 0x1e;
        }
        bVar8 = 1;
      }
      else {
        iVar4 = std::__cxx11::string::compare(local_d0);
        if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(local_d0), iVar4 != 0)) {
          std::operator+(&local_58,"Invalid value for boolean field \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
          psVar9 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_98.field_2._M_allocated_capacity = *psVar9;
            local_98.field_2._8_8_ = plVar6[3];
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar9;
            local_98._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_98._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::operator+(&local_78,&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
          psVar9 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_f0.field_2._M_allocated_capacity = *psVar9;
            local_f0.field_2._8_8_ = plVar6[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar9;
            local_f0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_f0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      &local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
              &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p)
                            ,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00226a7c;
        }
        if (*(int *)(field + 0x30) == 3) {
          pp_Var7 = reflection->_vptr_Reflection + 0x3e;
        }
        else {
          pp_Var7 = reflection->_vptr_Reflection + 0x1e;
        }
        bVar8 = 0;
      }
      bVar3 = true;
      (**pp_Var7)(reflection,message,field,(ulong)bVar8);
    }
    else {
LAB_00226a7c:
      bVar3 = false;
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
    goto joined_r0x002264db;
  case 8:
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    this_00 = *(EnumDescriptor **)(field + 0x50);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,(string *)local_d0);
      bVar2 = true;
      if (!bVar3) goto LAB_00226910;
      pEVar5 = EnumDescriptor::FindValueByName(this_00,(string *)local_d0);
LAB_0022673d:
      if (pEVar5 != (EnumValueDescriptor *)0x0) {
        (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x20])
                  (reflection,message,field,pEVar5);
        bVar2 = false;
        goto LAB_00226910;
      }
      std::operator+(&local_58,"Unknown enumeration value of \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar6[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_98._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::operator+(&local_78,&local_98,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_f0.field_2._M_allocated_capacity = *psVar9;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar9;
        local_f0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_f0
                 );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
LAB_00226905:
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"-","");
      __n = (this->tokenizer_).current_.text._M_string_length;
      if ((__n == local_f0._M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_f0._M_dataplus._M_p,
                        __n), iVar4 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
LAB_002266b7:
        bVar3 = ConsumeSignedInteger(this,(int64 *)&local_78,0x7fffffff);
        if (bVar3) {
          local_38 = this_00;
          SimpleItoa_abi_cxx11_
                    (&local_f0,
                     (protobuf *)
                     CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),i);
          std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          pEVar5 = EnumDescriptor::FindValueByNumber(local_38,(int)local_78._M_dataplus._M_p);
        }
        else {
          pEVar5 = (EnumValueDescriptor *)0x0;
        }
        bVar2 = true;
        if (!bVar3) goto LAB_00226910;
        goto LAB_0022673d;
      }
      TVar1 = (this->tokenizer_).current_.type;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (TVar1 == TYPE_INTEGER) goto LAB_002266b7;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Expected integer or identifier.","");
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_f0
                 );
      local_58.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
      local_58._M_dataplus._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_00226905;
    }
    bVar2 = true;
LAB_00226910:
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
    if (bVar2) {
      return false;
    }
    return true;
  case 9:
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    local_d0._0_8_ = local_d0 + 0x10;
    bVar3 = ConsumeString(this,(string *)local_d0);
    if (bVar3) {
      (*reflection->_vptr_Reflection[(ulong)(*(int *)(field + 0x30) == 3) * 0x20 + 0x1f])
                (reflection,message,field,local_d0);
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
joined_r0x002264db:
    if (!bVar3) {
      return false;
    }
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
               ,0x285);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_d0,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)&local_f0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
  }
  return true;
}

Assistant:

bool ConsumeFieldValue(Message* message,
                         const Reflection* reflection,
                         const FieldDescriptor* field) {

// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                                  \
        if (field->is_repeated()) {                                \
          reflection->Add##CPPTYPE(message, field, VALUE);         \
        } else {                                                   \
          reflection->Set##CPPTYPE(message, field, VALUE);         \
        }                                                          \

    switch(field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, static_cast<float>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name()
                        + "\". Value: \"" + value  + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        string value;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = NULL;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          int64 int_value;
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = SimpleItoa(int_value);        // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier.");
          return false;
        }

        if (enum_value == NULL) {
          ReportError("Unknown enumeration value of \"" + value  + "\" for "
                      "field \"" + field->name() + "\".");
          return false;
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }